

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_SCHEME_ECDAA_Unmarshal(TPMS_SCHEME_ECDAA *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_SCHEME_ECDAA *target_local;
  
  target_local._4_4_ = TPMI_ALG_HASH_Unmarshal(&target->hashAlg,buffer,size,0);
  if (target_local._4_4_ == 0) {
    target_local._4_4_ = UINT16_Unmarshal(&target->count,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_SCHEME_ECDAA_Unmarshal(TPMS_SCHEME_ECDAA *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&(target->hashAlg), buffer, size, 0);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT16_Unmarshal((UINT16 *)&(target->count), buffer, size);
    return result;
}